

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int termIsEquivalence(Parse *pParse,Expr *pExpr)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  CollSeq *p;
  Expr *in_RSI;
  Parse *in_RDI;
  CollSeq *pColl;
  char aff2;
  char aff1;
  Expr *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  int local_4;
  
  if ((in_RDI->db->dbOptFlags & 0x80) == 0) {
    if ((in_RSI->op == '5') || (in_RSI->op == '-')) {
      if ((in_RSI->flags & 1) == 0) {
        bVar1 = sqlite3ExprAffinity(in_stack_ffffffffffffffd8);
        bVar2 = sqlite3ExprAffinity(in_stack_ffffffffffffffd8);
        if ((bVar1 == bVar2) || ((0x42 < bVar1 && (0x42 < bVar2)))) {
          p = sqlite3BinaryCompareCollSeq
                        (in_RDI,in_RSI,
                         (Expr *)CONCAT17(bVar1,CONCAT16(bVar2,in_stack_ffffffffffffffe0)));
          iVar3 = sqlite3IsBinary(p);
          if (iVar3 == 0) {
            local_4 = sqlite3ExprCollSeqMatch
                                (in_RDI,in_RSI,
                                 (Expr *)CONCAT17(bVar1,CONCAT16(bVar2,in_stack_ffffffffffffffe0)));
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int termIsEquivalence(Parse *pParse, Expr *pExpr){
  char aff1, aff2;
  CollSeq *pColl;
  if( !OptimizationEnabled(pParse->db, SQLITE_Transitive) ) return 0;
  if( pExpr->op!=TK_EQ && pExpr->op!=TK_IS ) return 0;
  if( ExprHasProperty(pExpr, EP_FromJoin) ) return 0;
  aff1 = sqlite3ExprAffinity(pExpr->pLeft);
  aff2 = sqlite3ExprAffinity(pExpr->pRight);
  if( aff1!=aff2
   && (!sqlite3IsNumericAffinity(aff1) || !sqlite3IsNumericAffinity(aff2))
  ){
    return 0;
  }
  pColl = sqlite3BinaryCompareCollSeq(pParse, pExpr->pLeft, pExpr->pRight);
  if( sqlite3IsBinary(pColl) ) return 1;
  return sqlite3ExprCollSeqMatch(pParse, pExpr->pLeft, pExpr->pRight);
}